

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_source.cpp
# Opt level: O0

void __thiscall
ImportSource_addToImporter_Test::ImportSource_addToImporter_Test
          (ImportSource_addToImporter_Test *this)

{
  ImportSource_addToImporter_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__ImportSource_addToImporter_Test_001176a0;
  return;
}

Assistant:

TEST(ImportSource, addToImporter)
{
    auto importer = libcellml::Importer::create();

    // Add import source to importer:
    auto imp1 = libcellml::ImportSource::create();
    std::string url1 = "http://www.example.com#hello";
    imp1->setUrl(url1);

    EXPECT_TRUE(importer->addImportSource(imp1));
    EXPECT_EQ(size_t(1), importer->importSourceCount());
    EXPECT_EQ(imp1, importer->importSource(0));

    // Add the same one again:
    EXPECT_FALSE(importer->addImportSource(imp1));
    EXPECT_EQ(size_t(1), importer->importSourceCount());
    EXPECT_EQ(imp1, importer->importSource(0));

    // Add another with the same URL:
    auto imp2 = libcellml::ImportSource::create();
    imp2->setUrl(url1);

    EXPECT_TRUE(importer->addImportSource(imp2));
    EXPECT_EQ(size_t(2), importer->importSourceCount());
    EXPECT_EQ(imp2, importer->importSource(1));

    // Add another with a new URL:
    auto imp3 = libcellml::ImportSource::create();
    auto url3 = "http://www.example.com#bonjour";
    imp3->setUrl(url3);

    EXPECT_TRUE(importer->addImportSource(imp3));
    EXPECT_EQ(size_t(3), importer->importSourceCount());
    EXPECT_EQ(imp3, importer->importSource(2));
}